

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_zecho(CHAR_DATA *ch,char *argument)

{
  ROOM_INDEX_DATA *pRVar1;
  DESCRIPTOR_DATA **ppDVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  DESCRIPTOR_DATA *pDVar6;
  char buffer [9216];
  char acStack_2438 [9224];
  
  if (*argument == '\0') {
    send_to_char("Zone echo what?\n\r",ch);
    return;
  }
  pDVar6 = descriptor_list;
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    do {
      if (pDVar6->connected == 0) {
        pRVar1 = pDVar6->character->in_room;
        if (((pRVar1 != (ROOM_INDEX_DATA *)0x0) && (ch->in_room != (ROOM_INDEX_DATA *)0x0)) &&
           (pRVar1->area == ch->in_room->area)) {
          colorconv(acStack_2438,argument,pDVar6->character);
          iVar4 = get_trust(pDVar6->character);
          iVar5 = get_trust(ch);
          if ((iVar5 <= iVar4) && (bVar3 = is_npc(ch), !bVar3)) {
            send_to_char("zone> ",pDVar6->character);
          }
          send_to_char(acStack_2438,pDVar6->character);
          send_to_char("\n\r",pDVar6->character);
        }
      }
      ppDVar2 = &pDVar6->next;
      pDVar6 = *ppDVar2;
    } while (*ppDVar2 != (DESCRIPTOR_DATA *)0x0);
  }
  return;
}

Assistant:

void do_zecho(CHAR_DATA *ch, char *argument)
{
	char buffer[MAX_STRING_LENGTH * 2];
	DESCRIPTOR_DATA *d;

	if (argument[0] == '\0')
	{
		send_to_char("Zone echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character->in_room != nullptr
			&& ch->in_room != nullptr
			&& d->character->in_room->area == ch->in_room->area)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch) && !is_npc(ch))
				send_to_char("zone> ", d->character);

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}